

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O3

void __thiscall
OpenMPDefaultmapClause::generateDOT
          (OpenMPDefaultmapClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OpenMPDefaultmapClauseCategory OVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  undefined8 *puVar8;
  size_t sVar9;
  ulong *puVar10;
  long *plVar11;
  size_type *psVar12;
  ulong uVar13;
  undefined8 uVar14;
  uint uVar15;
  pointer ppcVar16;
  string __str_1;
  string node_id;
  string __str_6;
  string __str;
  string parameter_string;
  string current_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string clause_kind;
  string indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  long lStack_1b0;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  long *local_188;
  long local_180;
  long local_178;
  long lStack_170;
  ofstream *local_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  undefined8 uStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  char *local_120;
  undefined8 local_118;
  char local_110;
  undefined7 uStack_10f;
  long *local_100 [2];
  long local_f0 [2];
  allocator<char> local_d9;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  OpenMPDefaultmapClause *local_58;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_120 = &local_110;
  local_118 = 0;
  local_110 = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_168 = dot_file;
  local_58 = this;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)depth);
  uVar5 = -depth;
  if (0 < depth) {
    uVar5 = depth;
  }
  uVar15 = 1;
  if (9 < uVar5) {
    uVar13 = (ulong)uVar5;
    uVar4 = 4;
    do {
      uVar15 = uVar4;
      uVar6 = (uint)uVar13;
      if (uVar6 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_001497a1;
      }
      if (uVar6 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_001497a1;
      }
      if (uVar6 < 10000) goto LAB_001497a1;
      uVar13 = uVar13 / 10000;
      uVar4 = uVar15 + 4;
    } while (99999 < uVar6);
    uVar15 = uVar15 + 1;
  }
LAB_001497a1:
  local_188 = &local_178;
  std::__cxx11::string::_M_construct((ulong)&local_188,(char)uVar15 - (char)(depth >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)depth >> 0x1f) + (long)local_188),uVar15,uVar5);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,0x1a5ed4);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_1b8 = *puVar10;
    lStack_1b0 = plVar7[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar10;
    local_1c8 = (ulong *)*plVar7;
  }
  local_1c0 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
  puVar10 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar10) {
    local_150 = *puVar10;
    uStack_148 = puVar8[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar10;
    local_160 = (ulong *)*puVar8;
  }
  local_158 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  uVar5 = -index;
  if (0 < index) {
    uVar5 = index;
  }
  uVar15 = 1;
  if (9 < uVar5) {
    uVar13 = (ulong)uVar5;
    uVar4 = 4;
    do {
      uVar15 = uVar4;
      uVar6 = (uint)uVar13;
      if (uVar6 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_001498f7;
      }
      if (uVar6 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_001498f7;
      }
      if (uVar6 < 10000) goto LAB_001498f7;
      uVar13 = uVar13 / 10000;
      uVar4 = uVar15 + 4;
    } while (99999 < uVar6);
    uVar15 = uVar15 + 1;
  }
LAB_001498f7:
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)uVar15 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1e8._M_dataplus._M_p + ((uint)index >> 0x1f),uVar15,uVar5);
  uVar13 = 0xf;
  if (local_160 != &local_150) {
    uVar13 = local_150;
  }
  paVar1 = &local_1e8.field_2;
  if (uVar13 < local_1e8._M_string_length + local_158) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      uVar14 = local_1e8.field_2._M_allocated_capacity;
    }
    if (local_1e8._M_string_length + local_158 <= (ulong)uVar14) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_160);
      goto LAB_00149993;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_1e8._M_dataplus._M_p);
LAB_00149993:
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  psVar12 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_98.field_2._M_allocated_capacity = *psVar12;
    local_98.field_2._8_8_ = puVar8[3];
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar12;
    local_98._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_98._M_string_length = puVar8[1];
  *puVar8 = psVar12;
  puVar8[1] = 0;
  *(undefined1 *)psVar12 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,local_178 + 1);
  }
  std::operator+(&local_1e8,&local_78,parent_node);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_178 = *plVar11;
    lStack_170 = plVar7[3];
    local_188 = &local_178;
  }
  else {
    local_178 = *plVar11;
    local_188 = (long *)*plVar7;
  }
  local_180 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_188,(ulong)local_98._M_dataplus._M_p);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_1b8 = *puVar10;
    lStack_1b0 = plVar7[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar10;
    local_1c8 = (ulong *)*plVar7;
  }
  local_1c0 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
  puVar10 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar10) {
    local_150 = *puVar10;
    uStack_148 = puVar8[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar10;
    local_160 = (ulong *)*puVar8;
  }
  local_158 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_120,(string *)&local_160);
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,local_178 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = local_120;
  if (local_120 == (char *)0x0) {
    std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
  }
  else {
    sVar9 = strlen(local_120);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar3,sVar9);
  }
  std::__cxx11::string::append((char *)&local_78);
  OVar2 = local_58->category;
  local_158 = 0;
  local_150 = local_150 & 0xffffffffffffff00;
  uVar5 = local_58->behavior - OMPC_DEFAULTMAP_BEHAVIOR_alloc;
  local_160 = &local_150;
  if ((uVar5 < 7) &&
     (std::__cxx11::string::_M_replace
                ((ulong)&local_160,0,(char *)0x0,
                 (ulong)(&DAT_001a5cf8 + *(int *)(&DAT_001a5cf8 + (ulong)uVar5 * 4))),
     local_158 != 0)) {
    local_1c8 = &local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    std::__cxx11::string::append((char *)&local_1c8);
    std::operator+(&local_140,&local_78,&local_98);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
    puVar10 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar10) {
      local_198 = *puVar10;
      lStack_190 = plVar7[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *puVar10;
      local_1a8 = (ulong *)*plVar7;
    }
    local_1a0 = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_1c8);
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_1e8.field_2._M_allocated_capacity = *psVar12;
      local_1e8.field_2._8_8_ = plVar7[3];
      local_1e8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar12;
      local_1e8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_1e8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_178 = *plVar11;
      lStack_170 = plVar7[3];
      local_188 = &local_178;
    }
    else {
      local_178 = *plVar11;
      local_188 = (long *)*plVar7;
    }
    local_180 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_120,(string *)&local_188);
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    paVar1 = &local_140.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = local_120;
    if (local_120 == (char *)0x0) {
      std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
    }
    else {
      sVar9 = strlen(local_120);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar3,sVar9);
    }
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    std::__cxx11::string::append((char *)local_100);
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_100,(ulong)local_1c8);
    local_d8 = &local_c8;
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_c8 = *plVar11;
      lStack_c0 = plVar7[3];
    }
    else {
      local_c8 = *plVar11;
      local_d8 = (long *)*plVar7;
    }
    local_d0 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_a8 = *plVar11;
      lStack_a0 = plVar7[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar11;
      local_b8 = (long *)*plVar7;
    }
    local_b0 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_1c8);
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_140.field_2._M_allocated_capacity = *psVar12;
      local_140.field_2._8_8_ = plVar7[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar12;
      local_140._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_140._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
    local_1a8 = &local_198;
    puVar10 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar10) {
      local_198 = *puVar10;
      lStack_190 = plVar7[3];
    }
    else {
      local_198 = *puVar10;
      local_1a8 = (ulong *)*plVar7;
    }
    local_1a0 = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_160);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    puVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1e8.field_2._M_allocated_capacity = *puVar10;
      local_1e8.field_2._8_8_ = puVar8[3];
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *puVar10;
      local_1e8._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_1e8._M_string_length = puVar8[1];
    *puVar8 = puVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_178 = *plVar11;
      lStack_170 = plVar7[3];
      local_188 = &local_178;
    }
    else {
      local_178 = *plVar11;
      local_188 = (long *)*plVar7;
    }
    local_180 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_120,(string *)&local_188);
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_100[0] != local_f0) {
      operator_delete(local_100[0],local_f0[0] + 1);
    }
    pcVar3 = local_120;
    if (local_120 == (char *)0x0) {
      std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
    }
    else {
      sVar9 = strlen(local_120);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar3,sVar9);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
  }
  local_158 = 0;
  *(undefined1 *)local_160 = 0;
  uVar5 = OVar2 - OMPC_DEFAULTMAP_CATEGORY_scalar;
  if (uVar5 < 4) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_160,0,(char *)0x0,
               (ulong)(&DAT_001a5d50 + *(int *)(&DAT_001a5d50 + (ulong)uVar5 * 4)));
  }
  if (local_158 != 0) {
    local_1c8 = &local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    std::__cxx11::string::append((char *)&local_1c8);
    std::operator+(&local_140,&local_78,&local_98);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
    puVar10 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar10) {
      local_198 = *puVar10;
      lStack_190 = plVar7[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *puVar10;
      local_1a8 = (ulong *)*plVar7;
    }
    local_1a0 = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_1c8);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_1e8.field_2._M_allocated_capacity = *psVar12;
      local_1e8.field_2._8_8_ = plVar7[3];
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar12;
      local_1e8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_1e8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_178 = *plVar11;
      lStack_170 = plVar7[3];
      local_188 = &local_178;
    }
    else {
      local_178 = *plVar11;
      local_188 = (long *)*plVar7;
    }
    local_180 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_120,(string *)&local_188);
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    paVar1 = &local_140.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = local_120;
    if (local_120 == (char *)0x0) {
      std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
    }
    else {
      sVar9 = strlen(local_120);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar3,sVar9);
    }
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    std::__cxx11::string::append((char *)local_100);
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_100,(ulong)local_1c8);
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_c8 = *plVar11;
      lStack_c0 = plVar7[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *plVar11;
      local_d8 = (long *)*plVar7;
    }
    local_d0 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_a8 = *plVar11;
      lStack_a0 = plVar7[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar11;
      local_b8 = (long *)*plVar7;
    }
    local_b0 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_1c8);
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_140.field_2._M_allocated_capacity = *psVar12;
      local_140.field_2._8_8_ = plVar7[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar12;
      local_140._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_140._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
    puVar10 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar10) {
      local_198 = *puVar10;
      lStack_190 = plVar7[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *puVar10;
      local_1a8 = (ulong *)*plVar7;
    }
    local_1a0 = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_160);
    puVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1e8.field_2._M_allocated_capacity = *puVar10;
      local_1e8.field_2._8_8_ = puVar8[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *puVar10;
      local_1e8._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_1e8._M_string_length = puVar8[1];
    *puVar8 = puVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_178 = *plVar11;
      lStack_170 = plVar7[3];
      local_188 = &local_178;
    }
    else {
      local_178 = *plVar11;
      local_188 = (long *)*plVar7;
    }
    local_180 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_120,(string *)&local_188);
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_100[0] != local_f0) {
      operator_delete(local_100[0],local_f0[0] + 1);
    }
    pcVar3 = local_120;
    if (local_120 == (char *)0x0) {
      std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
    }
    else {
      sVar9 = strlen(local_120);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar3,sVar9);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
  }
  local_1c8 = &local_1b8;
  local_1c0 = 0;
  local_1b8 = local_1b8 & 0xffffffffffffff00;
  ppcVar16 = (local_58->super_OpenMPClause).expressions.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppcVar16 !=
      (local_58->super_OpenMPClause).expressions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar5 = 0;
    do {
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,local_98._M_dataplus._M_p,
                 local_98._M_dataplus._M_p + local_98._M_string_length);
      std::__cxx11::string::append((char *)&local_1e8);
      uVar15 = 1;
      if (9 < uVar5) {
        uVar13 = (ulong)uVar5;
        uVar4 = 4;
        do {
          uVar15 = uVar4;
          uVar6 = (uint)uVar13;
          if (uVar6 < 100) {
            uVar15 = uVar15 - 2;
            goto LAB_0014a95f;
          }
          if (uVar6 < 1000) {
            uVar15 = uVar15 - 1;
            goto LAB_0014a95f;
          }
          if (uVar6 < 10000) goto LAB_0014a95f;
          uVar13 = uVar13 / 10000;
          uVar4 = uVar15 + 4;
        } while (99999 < uVar6);
        uVar15 = uVar15 + 1;
      }
LAB_0014a95f:
      local_1a8 = &local_198;
      std::__cxx11::string::_M_construct((ulong)&local_1a8,(char)uVar15);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1a8,uVar15,uVar5);
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        uVar14 = local_1e8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_1a0 + local_1e8._M_string_length) {
        uVar13 = 0xf;
        if (local_1a8 != &local_198) {
          uVar13 = local_198;
        }
        if (uVar13 < local_1a0 + local_1e8._M_string_length) goto LAB_0014a9cd;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1a8,0,(char *)0x0,(ulong)local_1e8._M_dataplus._M_p);
      }
      else {
LAB_0014a9cd:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_1a8);
      }
      plVar7 = puVar8 + 2;
      if ((long *)*puVar8 == plVar7) {
        local_178 = *plVar7;
        lStack_170 = puVar8[3];
        local_188 = &local_178;
      }
      else {
        local_178 = *plVar7;
        local_188 = (long *)*puVar8;
      }
      local_180 = puVar8[1];
      *puVar8 = plVar7;
      puVar8[1] = 0;
      *(undefined1 *)plVar7 = 0;
      std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_188);
      if (local_188 != &local_178) {
        operator_delete(local_188,local_178 + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_140,&local_78,&local_98);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_198 = *puVar10;
        lStack_190 = plVar7[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *puVar10;
        local_1a8 = (ulong *)*plVar7;
      }
      local_1a0 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_1c8);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_1e8.field_2._M_allocated_capacity = *psVar12;
        local_1e8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_1e8.field_2._M_allocated_capacity = *psVar12;
        local_1e8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_1e8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
      plVar7 = puVar8 + 2;
      if ((long *)*puVar8 == plVar7) {
        local_178 = *plVar7;
        lStack_170 = puVar8[3];
        local_188 = &local_178;
      }
      else {
        local_178 = *plVar7;
        local_188 = (long *)*puVar8;
      }
      local_180 = puVar8[1];
      *puVar8 = plVar7;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_188);
      if (local_188 != &local_178) {
        operator_delete(local_188,local_178 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = local_120;
      if (local_120 == (char *)0x0) {
        std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
      }
      else {
        sVar9 = strlen(local_120);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar3,sVar9);
      }
      local_100[0] = local_f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_100,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      std::__cxx11::string::append((char *)local_100);
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_100,(ulong)local_1c8);
      local_d8 = &local_c8;
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_c8 = *plVar11;
        lStack_c0 = plVar7[3];
      }
      else {
        local_c8 = *plVar11;
        local_d8 = (long *)*plVar7;
      }
      local_d0 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_b8 = &local_a8;
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_a8 = *plVar11;
        lStack_a0 = plVar7[3];
      }
      else {
        local_a8 = *plVar11;
        local_b8 = (long *)*plVar7;
      }
      local_b0 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_1c8);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_140.field_2._M_allocated_capacity = *psVar12;
        local_140.field_2._8_8_ = plVar7[3];
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar12;
        local_140._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_140._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_198 = *puVar10;
        lStack_190 = plVar7[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *puVar10;
        local_1a8 = (ulong *)*plVar7;
      }
      local_1a0 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*ppcVar16,&local_d9);
      uVar13 = 0xf;
      if (local_1a8 != &local_198) {
        uVar13 = local_198;
      }
      if (uVar13 < (ulong)(local_48 + local_1a0)) {
        uVar13 = 0xf;
        if (local_50 != local_40) {
          uVar13 = local_40[0];
        }
        if (uVar13 < (ulong)(local_48 + local_1a0)) goto LAB_0014aea6;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_1a8);
      }
      else {
LAB_0014aea6:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_50);
      }
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      puVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_1e8.field_2._M_allocated_capacity = *puVar10;
        local_1e8.field_2._8_8_ = puVar8[3];
      }
      else {
        local_1e8.field_2._M_allocated_capacity = *puVar10;
        local_1e8._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_1e8._M_string_length = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)puVar10 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_178 = *plVar11;
        lStack_170 = plVar7[3];
        local_188 = &local_178;
      }
      else {
        local_178 = *plVar11;
        local_188 = (long *)*plVar7;
      }
      local_180 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_188);
      if (local_188 != &local_178) {
        operator_delete(local_188,local_178 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_100[0] != local_f0) {
        operator_delete(local_100[0],local_f0[0] + 1);
      }
      pcVar3 = local_120;
      if (local_120 == (char *)0x0) {
        std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
      }
      else {
        sVar9 = strlen(local_120);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar3,sVar9);
      }
      uVar5 = uVar5 + 1;
      ppcVar16 = ppcVar16 + 1;
    } while (ppcVar16 !=
             (local_58->super_OpenMPClause).expressions.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  return;
}

Assistant:

void OpenMPDefaultmapClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "defaultmap_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPDefaultmapClauseBehavior behavior = this->getBehavior();
    OpenMPDefaultmapClauseCategory category = this->getCategory();
    std::string parameter_string;
    switch (behavior) {
        case OMPC_DEFAULTMAP_BEHAVIOR_alloc:
            parameter_string = "alloc";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_to:
            parameter_string = "to";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_from:
            parameter_string = "from";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_tofrom:
            parameter_string = "tofrom";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_firstprivate:
            parameter_string = "firstprivate";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_none:
            parameter_string = "none";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_default:
            parameter_string = "default";
            break;
        default:
            ;
    }
    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_behavior";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };
    parameter_string.clear();
    switch (category) {
        case OMPC_DEFAULTMAP_CATEGORY_scalar:
            parameter_string = "scalar";
            break;
        case OMPC_DEFAULTMAP_CATEGORY_aggregate:
            parameter_string  = "aggregate";
            break;
        case OMPC_DEFAULTMAP_CATEGORY_pointer:
            parameter_string = "pointer";
            break;
        case OMPC_DEFAULTMAP_CATEGORY_allocatable:
            parameter_string = "allocatable";
            break;
        default:
            ;
    };

    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_category";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };

   std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };
}